

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApproxCheck.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3697::ApproxCheck::checkUseChain
          (ApproxCheck *this,Instruction *instr,int level,
          vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *history)

{
  ApproxCheck *instr_00;
  pointer ppIVar1;
  pointer ppIVar2;
  bool bVar3;
  char cVar4;
  char *pcVar5;
  Use *Val;
  op_iterator pUVar6;
  pointer ppIVar7;
  Instruction *vi;
  Value *evalAddrInst;
  string newopcode;
  string opcode;
  ApproxCheck *local_c8;
  ApproxCheck *local_c0;
  Instruction *local_b8;
  Value *local_b0;
  vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *local_a8;
  _Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar5 = llvm::Instruction::getOpcodeName(instr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,pcVar5,(allocator<char> *)&local_88);
  pcVar5 = "store";
  bVar3 = std::operator==(&local_50,"store");
  Val = llvm::User::getOperandList((User *)instr);
  local_a8 = &this->addrList;
  local_c0 = this;
  local_b8 = instr;
  do {
    pUVar6 = llvm::User::op_end((User *)instr);
    if (Val == pUVar6) {
      std::__cxx11::string::~string((string *)&local_50);
      return;
    }
    if ((bVar3 == false) &&
       (bVar3 = llvm::isa_impl_wrap<llvm::Instruction,_const_llvm::Use,_llvm::Value_*>::doit(Val),
       bVar3)) {
      local_c8 = (ApproxCheck *)llvm::dyn_cast<llvm::Instruction,llvm::Use>(Val);
      markInstruction(local_c8,(Instruction *)pcVar5);
      pcVar5 = llvm::Instruction::getOpcodeName((Instruction *)local_c8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,pcVar5,(allocator<char> *)&local_b0);
      bVar3 = std::operator!=(&local_88,"load");
      if (bVar3) {
        std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::vector
                  ((vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *)&local_a0,
                   history);
        ppIVar2 = local_a0._M_impl.super__Vector_impl_data._M_start;
        do {
          ppIVar7 = ppIVar2;
          ppIVar1 = local_a0._M_impl.super__Vector_impl_data._M_finish;
          if (local_a0._M_impl.super__Vector_impl_data._M_finish <= ppIVar7) {
            std::_Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::
            ~_Vector_base(&local_a0);
            goto LAB_0010614c;
          }
          cVar4 = llvm::Instruction::isIdenticalTo(*ppIVar7);
          ppIVar2 = ppIVar7 + 1;
        } while (cVar4 == '\0');
        std::_Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::~_Vector_base
                  (&local_a0);
        this = local_c0;
        instr = local_b8;
        if (ppIVar1 <= ppIVar7) {
LAB_0010614c:
          instr = local_b8;
          this = local_c0;
          std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::push_back
                    (history,(value_type *)&local_c8);
          instr_00 = local_c8;
          std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::vector
                    ((vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *)&local_68,
                     history);
          checkUseChain(this,(Instruction *)instr_00,level + 1,
                        (vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *)
                        &local_68);
          std::_Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::
          ~_Vector_base(&local_68);
        }
      }
      pcVar5 = "load";
      bVar3 = std::operator==(&local_88,"load");
      if (bVar3) {
        pcVar5 = (char *)findAddressDependency(local_c8,(Instruction *)pcVar5);
        local_b0 = (Value *)pcVar5;
        bVar3 = isInAddrList(this,(Value *)pcVar5);
        if (!bVar3) {
          pcVar5 = (char *)&local_b0;
          std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::push_back
                    (local_a8,(value_type *)pcVar5);
        }
      }
      std::__cxx11::string::~string((string *)&local_88);
    }
    Val = Val + 0x20;
    bVar3 = false;
  } while( true );
}

Assistant:

void checkUseChain(Instruction* instr, int level, std::vector<Instruction*> history) {
			std::string opcode = instr->getOpcodeName();
			bool skipFirst = (opcode == "store");

			for (User::op_iterator i = instr->op_begin(); i != instr->op_end(); i++) {
				if (skipFirst) {
					skipFirst = false;
				} else if (isa<Instruction>(*i)) {
					Instruction *vi = dyn_cast<Instruction>(*i);
					markInstruction(vi);

					// Print
					// for (int j = 0; j < level; j++) { errs() << "\t"; }
					// errs() << "(" << level << ")" << *vi << "\n";

					std::string newopcode = vi->getOpcodeName();
					if (newopcode != "load" && !vectorContains(history, vi)) {
						history.push_back(vi);
						ApproxCheck::checkUseChain(vi, level + 1, history);
					}

					if (newopcode == "load") {
						// Found some "address" stored in memory.
						Value* evalAddrInst = findAddressDependency(vi);
						if(!isInAddrList(evalAddrInst)) {
							addrList.push_back(evalAddrInst);
						}
					}
				}
			}
		}